

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderDiscardTests.cpp
# Opt level: O2

ShaderDiscardCase *
deqp::gles2::Functional::makeDiscardCase(Context *context,DiscardTemplate tmpl,DiscardMode mode)

{
  ShaderDiscardCase *pSVar1;
  mapped_type *pmVar2;
  char *pcVar3;
  code *evalFunc;
  ulong uVar4;
  ulong uVar5;
  string name;
  string description;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  StringTemplate shaderTemplate;
  allocator<char> local_119;
  key_type local_118;
  ShaderDiscardCase *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  char *local_d0;
  Context *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [32];
  _Base_ptr local_80;
  size_t local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  StringTemplate local_50;
  
  uVar5 = (ulong)tmpl;
  if (tmpl < DISCARDTEMPLATE_LAST) {
    pcVar3 = &DAT_01810fdc + *(int *)(&DAT_01810fdc + uVar5 * 4);
  }
  else {
    pcVar3 = (char *)0x0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,pcVar3,(allocator<char> *)&local_118);
  tcu::StringTemplate::StringTemplate(&local_50,(string *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  local_a0._24_8_ = local_a0 + 8;
  local_a0._8_4_ = _S_red;
  local_a0._16_8_ = 0;
  local_78 = 0;
  uVar4 = (ulong)mode;
  local_80 = (_Base_ptr)local_a0._24_8_;
  switch(uVar4) {
  case 0:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"DISCARD",(allocator<char> *)&local_f0);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_a0,&local_118);
    std::__cxx11::string::assign((char *)pmVar2);
    break;
  case 1:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"DISCARD",(allocator<char> *)&local_f0);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_a0,&local_118);
    std::__cxx11::string::assign((char *)pmVar2);
    break;
  case 2:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"DISCARD",(allocator<char> *)&local_f0);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_a0,&local_118);
    std::__cxx11::string::assign((char *)pmVar2);
    break;
  case 3:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"DISCARD",(allocator<char> *)&local_f0);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_a0,&local_118);
    std::__cxx11::string::assign((char *)pmVar2);
    break;
  case 4:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"DISCARD",(allocator<char> *)&local_f0);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_a0,&local_118);
    std::__cxx11::string::assign((char *)pmVar2);
    break;
  default:
    goto switchD_00e6416f_default;
  }
  std::__cxx11::string::~string((string *)&local_118);
switchD_00e6416f_default:
  if (tmpl < DISCARDTEMPLATE_LAST) {
    pcVar3 = &DAT_01810ff0 + *(int *)(&DAT_01810ff0 + uVar5 * 4);
  }
  else {
    pcVar3 = (char *)0x0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,pcVar3,(allocator<char> *)&local_70);
  std::operator+(&local_f0,&local_c0,"_");
  if (mode < DISCARDMODE_LAST) {
    pcVar3 = &DAT_01811004 + *(int *)(&DAT_01811004 + uVar4 * 4);
  }
  else {
    pcVar3 = (char *)0x0;
  }
  std::operator+(&local_118,&local_f0,pcVar3);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (mode < DISCARDMODE_LAST) {
    pcVar3 = &DAT_01811018 + *(int *)(&DAT_01811018 + uVar4 * 4);
  }
  else {
    pcVar3 = (char *)0x0;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar3,&local_119);
  std::operator+(&local_c0,&local_70," in ");
  if (tmpl < DISCARDTEMPLATE_LAST) {
    pcVar3 = &DAT_0181102c + *(int *)(&DAT_0181102c + uVar5 * 4);
  }
  else {
    pcVar3 = (char *)0x0;
  }
  local_c8 = context;
  std::operator+(&local_f0,&local_c0,pcVar3);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_70);
  local_f8 = (ShaderDiscardCase *)operator_new(0x138);
  local_d0 = local_118._M_dataplus._M_p;
  tcu::StringTemplate::specialize
            (&local_c0,&local_50,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_a0);
  pSVar1 = local_f8;
  if (mode - DISCARDMODE_NEVER < 4) {
    evalFunc = (code *)(&PTR_evalDiscardNever_01e19fa0)[mode - DISCARDMODE_NEVER];
  }
  else {
    evalFunc = evalDiscardAlways;
  }
  ShaderDiscardCase::ShaderDiscardCase
            (local_f8,local_c8,local_d0,local_f0._M_dataplus._M_p,local_c0._M_dataplus._M_p,evalFunc
             ,(uint)(mode == DISCARDMODE_TEXTURE) +
              (uint)(tmpl == DISCARDTEMPLATE_MAIN_DYNAMIC_LOOP) * 2);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_118);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_a0);
  tcu::StringTemplate::~StringTemplate(&local_50);
  return pSVar1;
}

Assistant:

ShaderDiscardCase* makeDiscardCase (Context& context, DiscardTemplate tmpl, DiscardMode mode)
{
	StringTemplate shaderTemplate(getTemplate(tmpl));

	map<string, string> params;

	switch (mode)
	{
		case DISCARDMODE_ALWAYS:	params["DISCARD"] = "discard";										break;
		case DISCARDMODE_NEVER:		params["DISCARD"] = "if (false) discard";							break;
		case DISCARDMODE_UNIFORM:	params["DISCARD"] = "if (ui_one > 0) discard";						break;
		case DISCARDMODE_DYNAMIC:	params["DISCARD"] = "if (v_coords.x+v_coords.y > 0.0) discard";		break;
		case DISCARDMODE_TEXTURE:	params["DISCARD"] = "if (texture2D(ut_brick, v_coords.xy*0.25+0.5).x < 0.7) discard";	break;
		default:
			DE_ASSERT(DE_FALSE);
			break;
	}

	string		name			= string(getTemplateName(tmpl)) + "_" + getModeName(mode);
	string		description		= string(getModeDesc(mode)) + " in " + getTemplateDesc(tmpl);
	deUint32	flags			= (mode == DISCARDMODE_TEXTURE ? FLAG_USES_TEXTURES : 0)
								| (tmpl == DISCARDTEMPLATE_MAIN_DYNAMIC_LOOP ? FLAG_REQUIRES_DYNAMIC_LOOPS : 0);

	return new ShaderDiscardCase(context, name.c_str(), description.c_str(), shaderTemplate.specialize(params).c_str(), getEvalFunc(mode), flags);
}